

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall dxil_spv::CFGNode::CFGNode(CFGNode *this,CFGNodePool *pool_)

{
  CFGNodePool *pool__local;
  CFGNode *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&this->name);
  this->id = 0;
  this->userdata = (void *)0x0;
  IRBlock::IRBlock(&this->ir);
  this->pool = pool_;
  this->forward_post_visit_order = 0;
  this->backward_post_visit_order = 0;
  this->visited = false;
  this->backward_visited = false;
  this->traversing = false;
  this->freeze_structured_analysis = false;
  this->is_pseudo_back_edge = false;
  this->merge = None;
  this->loop_merge_block = (CFGNode *)0x0;
  this->loop_ladder_block = (CFGNode *)0x0;
  this->selection_merge_block = (CFGNode *)0x0;
  this->split_merge_block_candidate = (CFGNode *)0x0;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&this->headers);
  this->immediate_dominator = (CFGNode *)0x0;
  this->immediate_post_dominator = (CFGNode *)0x0;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&this->succ);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&this->pred);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&this->fake_succ);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&this->fake_pred);
  this->pred_back_edge = (CFGNode *)0x0;
  this->succ_back_edge = (CFGNode *)0x0;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&this->dominance_frontier);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&this->post_dominance_frontier);
  return;
}

Assistant:

CFGNode::CFGNode(CFGNodePool &pool_)
	: pool(pool_)
{
}